

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::variable_decl_is_remapped_storage
          (CompilerMSL *this,SPIRVariable *variable,StorageClass storage)

{
  bool bVar1;
  ExecutionModel EVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  
  bVar1 = true;
  if (variable->storage != storage) {
    if (storage == StorageBuffer) {
      uVar3 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(variable->super_IVariant).self.id,BuiltIn);
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if ((EVar2 == ExecutionModelTessellationEvaluation) &&
         (bVar1 = Compiler::is_builtin_variable((Compiler *)this,variable), bVar1)) {
        if (uVar3 == 7) {
          return false;
        }
        if (uVar3 == 0xd) {
          return false;
        }
      }
      if (((variable->storage | StorageClassUniform) == Output) &&
         (bVar1 = variable_storage_requires_stage_io(this,variable->storage), !bVar1)) {
        if (variable->storage != Output) {
          return true;
        }
        bVar1 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,variable);
        return !bVar1;
      }
    }
    else if (storage == StorageClassWorkgroup) {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if ((EVar2 == ExecutionModelTessellationControl) && (variable->storage == Output)) {
        pSVar4 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(variable->super_IVariant).field_0xc);
        bVar1 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar4->super_IVariant).self.id,Block);
        if (bVar1) {
          return true;
        }
      }
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar1 = variable->storage == Output;
      if ((bool)(~bVar1 & 1U | EVar2 == ExecutionModelMeshEXT)) {
        return EVar2 == ExecutionModelMeshEXT && bVar1;
      }
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if (EVar2 == ExecutionModelTessellationControl) {
        bVar1 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,variable);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompilerMSL::variable_decl_is_remapped_storage(const SPIRVariable &variable, spv::StorageClass storage) const
{
	if (variable.storage == storage)
		return true;

	if (storage == StorageClassWorkgroup)
	{
		// Specially masked IO block variable.
		// Normally, we will never access IO blocks directly here.
		// The only scenario which that should occur is with a masked IO block.
		if (is_tesc_shader() && variable.storage == StorageClassOutput &&
		    has_decoration(get<SPIRType>(variable.basetype).self, DecorationBlock))
		{
			return true;
		}

		if (is_mesh_shader())
			return variable.storage == StorageClassOutput;

		return variable.storage == StorageClassOutput && is_tesc_shader() && is_stage_output_variable_masked(variable);
	}
	else if (storage == StorageClassStorageBuffer)
	{
		// These builtins are passed directly; we don't want to use remapping
		// for them.
		auto builtin = (BuiltIn)get_decoration(variable.self, DecorationBuiltIn);
		if (is_tese_shader() && is_builtin_variable(variable) && (builtin == BuiltInTessCoord || builtin == BuiltInPrimitiveId))
			return false;

		// We won't be able to catch writes to control point outputs here since variable
		// refers to a function local pointer.
		// This is fine, as there cannot be concurrent writers to that memory anyways,
		// so we just ignore that case.

		return (variable.storage == StorageClassOutput || variable.storage == StorageClassInput) &&
		       !variable_storage_requires_stage_io(variable.storage) &&
		       (variable.storage != StorageClassOutput || !is_stage_output_variable_masked(variable));
	}
	else
	{
		return false;
	}
}